

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__jpg_writeBits(stbi__write_context *s,int *bitBufP,int *bitCntP,unsigned_short *bs)

{
  char cVar1;
  ushort *in_RCX;
  int *in_RDX;
  uint *in_RSI;
  uchar c;
  int bitCnt;
  int bitBuf;
  uchar in_stack_ffffffffffffffcf;
  undefined7 in_stack_ffffffffffffffd0;
  int local_28;
  uint local_24;
  
  local_28 = (uint)in_RCX[1] + *in_RDX;
  local_24 = (uint)*in_RCX << (0x18U - (char)local_28 & 0x1f) | *in_RSI;
  for (; 7 < local_28; local_28 = local_28 + -8) {
    cVar1 = (char)(local_24 >> 0x10);
    stbiw__putc((stbi__write_context *)CONCAT17(cVar1,in_stack_ffffffffffffffd0),
                in_stack_ffffffffffffffcf);
    if (cVar1 == -1) {
      stbiw__putc((stbi__write_context *)CONCAT17(0xff,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcf);
    }
    local_24 = local_24 << 8;
  }
  *in_RSI = local_24;
  *in_RDX = local_28;
  return;
}

Assistant:

static void stbiw__jpg_writeBits(stbi__write_context *s, int *bitBufP, int *bitCntP, const unsigned short *bs) {
   int bitBuf = *bitBufP, bitCnt = *bitCntP;
   bitCnt += bs[1];
   bitBuf |= bs[0] << (24 - bitCnt);
   while(bitCnt >= 8) {
      unsigned char c = (bitBuf >> 16) & 255;
      stbiw__putc(s, c);
      if(c == 255) {
         stbiw__putc(s, 0);
      }
      bitBuf <<= 8;
      bitCnt -= 8;
   }
   *bitBufP = bitBuf;
   *bitCntP = bitCnt;
}